

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.cpp
# Opt level: O2

void anon_unknown.dwarf_23e1e35::ComputeTag
               (ChaCha20 *chacha20,Span<const_std::byte> aad,Span<const_std::byte> cipher,
               Span<std::byte> tag)

{
  long lVar1;
  long in_FS_OFFSET;
  Span<std::byte> out;
  Span<const_std::byte> key;
  byte length_desc [16];
  Poly1305 poly1305;
  byte first_block [64];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  out.m_size = 0x40;
  out.m_data = first_block;
  ChaCha20::Keystream(chacha20,out);
  key.m_size = 0x20;
  key.m_data = first_block;
  Poly1305::Poly1305((Poly1305 *)&poly1305.m_ctx,key);
  poly1305_donna::poly1305_update(&poly1305.m_ctx,aad.m_data,aad.m_size);
  poly1305_donna::poly1305_update
            (&poly1305.m_ctx,ComputeTag::PADDING,(ulong)(-(int)aad.m_size & 0xf));
  poly1305_donna::poly1305_update(&poly1305.m_ctx,cipher.m_data,cipher.m_size);
  poly1305_donna::poly1305_update
            (&poly1305.m_ctx,ComputeTag::PADDING,(ulong)(-(int)cipher.m_size & 0xf));
  WriteLE64(length_desc,aad.m_size);
  WriteLE64(length_desc + 8,cipher.m_size);
  poly1305_donna::poly1305_update(&poly1305.m_ctx,length_desc,0x10);
  Poly1305::Finalize((Poly1305 *)&poly1305.m_ctx,tag);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ComputeTag(ChaCha20& chacha20, Span<const std::byte> aad, Span<const std::byte> cipher, Span<std::byte> tag) noexcept
{
    static const std::byte PADDING[16] = {{}};

    // Get block of keystream (use a full 64 byte buffer to avoid the need for chacha20's own buffering).
    std::byte first_block[ChaCha20Aligned::BLOCKLEN];
    chacha20.Keystream(first_block);

    // Use the first 32 bytes of the first keystream block as poly1305 key.
    Poly1305 poly1305{Span{first_block}.first(Poly1305::KEYLEN)};

    // Compute tag:
    // - Process the padded AAD with Poly1305.
    const unsigned aad_padding_length = (16 - (aad.size() % 16)) % 16;
    poly1305.Update(aad).Update(Span{PADDING}.first(aad_padding_length));
    // - Process the padded ciphertext with Poly1305.
    const unsigned cipher_padding_length = (16 - (cipher.size() % 16)) % 16;
    poly1305.Update(cipher).Update(Span{PADDING}.first(cipher_padding_length));
    // - Process the AAD and plaintext length with Poly1305.
    std::byte length_desc[Poly1305::TAGLEN];
    WriteLE64(UCharCast(length_desc), aad.size());
    WriteLE64(UCharCast(length_desc + 8), cipher.size());
    poly1305.Update(length_desc);

    // Output tag.
    poly1305.Finalize(tag);
}